

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O0

void brotli::StoreMetaBlockTrivial
               (uint8_t *input,size_t start_pos,size_t length,size_t mask,bool is_last,
               Command *commands,size_t n_commands,size_t *storage_ix,uint8_t *storage)

{
  pointer *this;
  allocator<unsigned_short> *paVar1;
  allocator<unsigned_char> *paVar2;
  reference pvVar3;
  reference pvVar4;
  reference cmd_depth_00;
  reference cmd_bits_00;
  reference dist_depth_00;
  reference dist_bits_00;
  allocator<unsigned_short> local_1879;
  undefined1 local_1878 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> dist_bits;
  undefined1 local_1858 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dist_depth;
  undefined1 local_1838 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> cmd_bits;
  undefined1 local_1818 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> cmd_depth;
  undefined1 local_17f8 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> lit_bits;
  allocator<unsigned_char> local_17c9;
  undefined1 local_17c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> lit_depth;
  HistogramDistance dist_histo;
  HistogramCommand cmd_histo;
  HistogramLiteral lit_histo;
  Command *commands_local;
  bool is_last_local;
  size_t mask_local;
  size_t length_local;
  size_t start_pos_local;
  uint8_t *input_local;
  
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  Histogram<256>::Histogram((Histogram<256> *)&cmd_histo.bit_cost_);
  Histogram<704>::Histogram((Histogram<704> *)&dist_histo.bit_cost_);
  this = &lit_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  Histogram<520>::Histogram((Histogram<520> *)this);
  BuildHistograms(input,start_pos,mask,commands,n_commands,(HistogramLiteral *)&cmd_histo.bit_cost_,
                  (HistogramCommand *)&dist_histo.bit_cost_,(HistogramDistance *)this);
  WriteBits(0xd,0,storage_ix,storage);
  std::allocator<unsigned_char>::allocator(&local_17c9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_17c8,0x100,&local_17c9);
  std::allocator<unsigned_char>::~allocator(&local_17c9);
  paVar1 = (allocator<unsigned_short> *)
           ((long)&cmd_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_short>::allocator(paVar1);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_17f8,0x100,paVar1);
  std::allocator<unsigned_short>::~allocator
            ((allocator<unsigned_short> *)
             ((long)&cmd_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar2 = (allocator<unsigned_char> *)
           ((long)&cmd_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(paVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,0x2c0,paVar2);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&cmd_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<unsigned_short> *)
           ((long)&dist_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_short>::allocator(paVar1);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1838,0x2c0,paVar1);
  std::allocator<unsigned_short>::~allocator
            ((allocator<unsigned_short> *)
             ((long)&dist_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar2 = (allocator<unsigned_char> *)
           ((long)&dist_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(paVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1858,0x40,paVar2);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&dist_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_short>::allocator(&local_1879);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1878,0x40,&local_1879)
  ;
  std::allocator<unsigned_short>::~allocator(&local_1879);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_17c8,0);
  pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_17f8,0);
  BuildAndStoreHuffmanTree((uint32_t *)&cmd_histo.bit_cost_,0x100,pvVar3,pvVar4,storage_ix,storage);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,0);
  pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1838,0);
  BuildAndStoreHuffmanTree((uint32_t *)&dist_histo.bit_cost_,0x2c0,pvVar3,pvVar4,storage_ix,storage)
  ;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1858,0);
  pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1878,0);
  BuildAndStoreHuffmanTree
            ((uint32_t *)
             &lit_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x40,pvVar3,pvVar4,storage_ix,storage);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_17c8,0);
  pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_17f8,0);
  cmd_depth_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,0);
  cmd_bits_00 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1838,0);
  dist_depth_00 =
       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1858,0);
  dist_bits_00 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1878,0)
  ;
  StoreDataWithHuffmanCodes
            (input,start_pos,mask,commands,n_commands,pvVar3,pvVar4,cmd_depth_00,cmd_bits_00,
             dist_depth_00,dist_bits_00,storage_ix,storage);
  if (is_last) {
    JumpToByteBoundary(storage_ix,storage);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1878);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1858);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1838);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_17f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_17c8);
  return;
}

Assistant:

void StoreMetaBlockTrivial(const uint8_t* input,
                           size_t start_pos,
                           size_t length,
                           size_t mask,
                           bool is_last,
                           const brotli::Command *commands,
                           size_t n_commands,
                           size_t *storage_ix,
                           uint8_t *storage) {
  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  HistogramLiteral lit_histo;
  HistogramCommand cmd_histo;
  HistogramDistance dist_histo;

  BuildHistograms(input, start_pos, mask, commands, n_commands,
                  &lit_histo, &cmd_histo, &dist_histo);

  WriteBits(13, 0, storage_ix, storage);

  std::vector<uint8_t> lit_depth(256);
  std::vector<uint16_t> lit_bits(256);
  std::vector<uint8_t> cmd_depth(kNumCommandPrefixes);
  std::vector<uint16_t> cmd_bits(kNumCommandPrefixes);
  std::vector<uint8_t> dist_depth(64);
  std::vector<uint16_t> dist_bits(64);

  BuildAndStoreHuffmanTree(&lit_histo.data_[0], 256,
                           &lit_depth[0], &lit_bits[0],
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(&cmd_histo.data_[0], kNumCommandPrefixes,
                           &cmd_depth[0], &cmd_bits[0],
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(&dist_histo.data_[0], 64,
                           &dist_depth[0], &dist_bits[0],
                           storage_ix, storage);
  StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                            n_commands, &lit_depth[0], &lit_bits[0],
                            &cmd_depth[0], &cmd_bits[0],
                            &dist_depth[0], &dist_bits[0],
                            storage_ix, storage);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}